

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

BOOL js_get_fast_array(JSContext *ctx,JSValue obj,JSValue **arrpp,uint32_t *countp)

{
  JSValueUnion JVar1;
  JSObject *p;
  uint32_t *countp_local;
  JSValue **arrpp_local;
  JSContext *ctx_local;
  JSValue obj_local;
  BOOL local_4;
  
  JVar1 = obj.u;
  if ((((int)obj.tag == -1) && (*(short *)((long)JVar1.ptr + 6) == 2)) &&
     ((*(byte *)((long)JVar1.ptr + 5) >> 3 & 1) != 0)) {
    *countp = *(uint32_t *)((long)JVar1.ptr + 0x40);
    *arrpp = *(JSValue **)((long)JVar1.ptr + 0x38);
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static BOOL js_get_fast_array(JSContext *ctx, JSValueConst obj,
                              JSValue **arrpp, uint32_t *countp)
{
    /* Try and handle fast arrays explicitly */
    if (JS_VALUE_GET_TAG(obj) == JS_TAG_OBJECT) {
        JSObject *p = JS_VALUE_GET_OBJ(obj);
        if (p->class_id == JS_CLASS_ARRAY && p->fast_array) {
            *countp = p->u.array.count;
            *arrpp = p->u.array.u.values;
            return TRUE;
        }
    }
    return FALSE;
}